

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::Module::removeMemories(Module *this,function<bool_(wasm::Memory_*)> *pred)

{
  function<bool_(wasm::Memory_*)> local_40;
  
  std::function<bool_(wasm::Memory_*)>::function(&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
            (&this->memories,&this->memoriesMap,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void Module::removeMemories(std::function<bool(Memory*)> pred) {
  removeModuleElements(memories, memoriesMap, pred);
}